

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O0

bool __thiscall
draco::KdTreeAttributesDecoder::TransformAttributesToOriginalFormat(KdTreeAttributesDecoder *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  byte bVar3;
  int iVar4;
  DataType DVar5;
  int32_t iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  long lVar8;
  KdTreeAttributesDecoder *in_RDI;
  float fVar9;
  float value;
  int c;
  uint32_t i_1;
  uint32_t *portable_attribute_data;
  Dequantizer dequantizer;
  int out_byte_pos;
  int quant_val_id;
  unique_ptr<float[],_std::default_delete<float[]>_> att_val;
  int entry_size;
  int num_components;
  int32_t max_quantized_value;
  AttributeQuantizationTransform *transform;
  PointAttribute *src_att;
  vector<int,_std::allocator<int>_> signed_val;
  vector<unsigned_int,_std::allocator<unsigned_int>_> unsigned_val;
  PointAttribute *att;
  int att_id;
  int i;
  int num_processed_signed_components;
  int num_processed_quantized_attributes;
  undefined4 in_stack_fffffffffffffe48;
  int32_t in_stack_fffffffffffffe4c;
  PointCloud *in_stack_fffffffffffffe50;
  GeometryAttribute *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  AttributeValueIndex in_stack_fffffffffffffe64;
  DracoOptions<draco::GeometryAttribute::Type> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe74;
  PointAttribute *in_stack_fffffffffffffe80;
  PointAttribute *in_stack_fffffffffffffe88;
  PointAttribute *in_stack_fffffffffffffe90;
  undefined4 in_stack_ffffffffffffff00;
  uint uVar10;
  int local_ec;
  uint local_e8;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_e4;
  PointAttribute *local_e0;
  Dequantizer local_d4;
  int local_d0;
  int local_cc;
  int local_c0;
  uint local_bc;
  int32_t local_b8;
  allocator<char> local_b1;
  string local_b0 [36];
  Type local_8c;
  AttributeQuantizationTransform *local_88;
  pointer local_80;
  int local_78;
  undefined1 local_41 [25];
  PointAttribute *local_28;
  int local_20;
  uint local_1c;
  int local_18;
  int local_14;
  byte local_1;
  
  bVar2 = std::
          vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
          ::empty((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe64.value_,in_stack_fffffffffffffe60));
  if ((bVar2) &&
     (bVar2 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffe64.value_,in_stack_fffffffffffffe60)),
     bVar2)) {
    local_1 = 1;
  }
  else {
    local_14 = 0;
    local_18 = 0;
    local_1c = 0;
    while (uVar10 = local_1c,
          iVar4 = (*(in_RDI->super_AttributesDecoder).super_AttributesDecoderInterface.
                    _vptr_AttributesDecoderInterface[6])(), (int)uVar10 < iVar4) {
      local_20 = (*(in_RDI->super_AttributesDecoder).super_AttributesDecoderInterface.
                   _vptr_AttributesDecoderInterface[5])(in_RDI,(ulong)local_1c);
      iVar4 = (*(in_RDI->super_AttributesDecoder).super_AttributesDecoderInterface.
                _vptr_AttributesDecoderInterface[7])();
      PointCloudDecoder::point_cloud((PointCloudDecoder *)CONCAT44(extraout_var,iVar4));
      local_28 = PointCloud::attribute(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      DVar5 = GeometryAttribute::data_type(&local_28->super_GeometryAttribute);
      if (((DVar5 == DT_INT32) ||
          (DVar5 = GeometryAttribute::data_type(&local_28->super_GeometryAttribute),
          DVar5 == DT_INT16)) ||
         (DVar5 = GeometryAttribute::data_type(&local_28->super_GeometryAttribute), DVar5 == DT_INT8
         )) {
        GeometryAttribute::num_components(&local_28->super_GeometryAttribute);
        iVar4 = (int)((ulong)local_41 >> 0x20);
        std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1ed830);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   (size_type)in_stack_fffffffffffffe68,
                   (allocator_type *)
                   CONCAT44(in_stack_fffffffffffffe64.value_,in_stack_fffffffffffffe60));
        std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1ed85c);
        GeometryAttribute::num_components(&local_28->super_GeometryAttribute);
        std::allocator<int>::allocator((allocator<int> *)0x1ed899);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   (size_type)in_stack_fffffffffffffe68,
                   (allocator_type *)
                   CONCAT44(in_stack_fffffffffffffe64.value_,in_stack_fffffffffffffe60));
        std::allocator<int>::~allocator((allocator<int> *)0x1ed8c5);
        DVar5 = GeometryAttribute::data_type(&local_28->super_GeometryAttribute);
        if (DVar5 == DT_INT32) {
          bVar2 = TransformAttributeBackToSignedType<int>
                            (in_RDI,(PointAttribute *)CONCAT44(uVar10,in_stack_ffffffffffffff00),
                             iVar4);
          if (bVar2) goto LAB_001eda9a;
          local_1 = 0;
          local_78 = 1;
        }
        else {
          DVar5 = GeometryAttribute::data_type(&local_28->super_GeometryAttribute);
          if (DVar5 == DT_INT16) {
            bVar2 = TransformAttributeBackToSignedType<short>
                              (in_RDI,(PointAttribute *)CONCAT44(uVar10,in_stack_ffffffffffffff00),
                               iVar4);
            if (bVar2) {
LAB_001eda9a:
              bVar3 = GeometryAttribute::num_components(&local_28->super_GeometryAttribute);
              local_18 = (uint)bVar3 + local_18;
              local_78 = 0;
            }
            else {
              local_1 = 0;
              local_78 = 1;
            }
          }
          else {
            DVar5 = GeometryAttribute::data_type(&local_28->super_GeometryAttribute);
            if ((DVar5 != DT_INT8) ||
               (bVar2 = TransformAttributeBackToSignedType<signed_char>
                                  (in_RDI,(PointAttribute *)
                                          CONCAT44(uVar10,in_stack_ffffffffffffff00),iVar4), bVar2))
            goto LAB_001eda9a;
            local_1 = 0;
            local_78 = 1;
          }
        }
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffe64.value_,in_stack_fffffffffffffe60));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffe64.value_,in_stack_fffffffffffffe60));
joined_r0x001edaf0:
        if (local_78 != 0) goto LAB_001edfda;
      }
      else {
        DVar5 = GeometryAttribute::data_type(&local_28->super_GeometryAttribute);
        if (DVar5 == DT_FLOAT32) {
          std::
          vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
          ::operator[](&in_RDI->quantized_portable_attributes_,(long)local_14);
          local_80 = std::
                     unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                     ::get((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                            *)in_stack_fffffffffffffe50);
          local_88 = std::
                     vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                     ::operator[](&in_RDI->attribute_quantization_transforms_,(long)local_14);
          local_14 = local_14 + 1;
          iVar4 = (*(in_RDI->super_AttributesDecoder).super_AttributesDecoderInterface.
                    _vptr_AttributesDecoderInterface[7])();
          PointCloudDecoder::options((PointCloudDecoder *)CONCAT44(extraout_var_00,iVar4));
          local_8c = GeometryAttribute::attribute_type(&local_28->super_GeometryAttribute);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                     (allocator<char> *)in_stack_fffffffffffffe80);
          bVar2 = DracoOptions<draco::GeometryAttribute::Type>::GetAttributeBool
                            (in_stack_fffffffffffffe68,
                             (AttributeKey *)
                             CONCAT44(in_stack_fffffffffffffe64.value_,in_stack_fffffffffffffe60),
                             (string *)in_stack_fffffffffffffe58,
                             SUB81((ulong)in_stack_fffffffffffffe50 >> 0x38,0));
          std::__cxx11::string::~string(local_b0);
          std::allocator<char>::~allocator(&local_b1);
          if (!bVar2) {
            iVar6 = AttributeQuantizationTransform::quantization_bits(local_88);
            local_b8 = (1 << ((byte)iVar6 & 0x1f)) + -1;
            bVar3 = GeometryAttribute::num_components(&local_28->super_GeometryAttribute);
            local_bc = (uint)bVar3;
            local_c0 = local_bc << 2;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = (long)(int)local_bc;
            uVar7 = SUB168(auVar1 * ZEXT816(4),0);
            if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
              uVar7 = 0xffffffffffffffff;
            }
            operator_new__(uVar7);
            std::unique_ptr<float[],std::default_delete<float[]>>::
            unique_ptr<float*,std::default_delete<float[]>,void,bool>
                      ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                       in_stack_fffffffffffffe50,
                       (float *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
            local_cc = 0;
            local_d0 = 0;
            Dequantizer::Dequantizer(&local_d4);
            fVar9 = AttributeQuantizationTransform::range(local_88);
            bVar2 = Dequantizer::Init(&local_d4,fVar9,local_b8);
            if (bVar2) {
              IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_e4,0);
              in_stack_fffffffffffffe90 =
                   (PointAttribute *)
                   GeometryAttribute::GetAddress
                             (in_stack_fffffffffffffe58,in_stack_fffffffffffffe64);
              local_e8 = 0;
              local_e0 = in_stack_fffffffffffffe90;
              while( true ) {
                in_stack_fffffffffffffe80 = (PointAttribute *)(ulong)local_e8;
                in_stack_fffffffffffffe88 = (PointAttribute *)PointAttribute::size(local_80);
                if (in_stack_fffffffffffffe88 <= in_stack_fffffffffffffe80) break;
                for (local_ec = 0; local_ec < (int)local_bc; local_ec = local_ec + 1) {
                  lVar8 = (long)local_cc;
                  local_cc = local_cc + 1;
                  in_stack_fffffffffffffe74 =
                       Dequantizer::DequantizeFloat
                                 (&local_d4,
                                  *(int32_t *)
                                   ((long)&(local_e0->super_GeometryAttribute).buffer_ + lVar8 * 4))
                  ;
                  fVar9 = AttributeQuantizationTransform::min_value
                                    ((AttributeQuantizationTransform *)in_stack_fffffffffffffe50,
                                     in_stack_fffffffffffffe4c);
                  in_stack_fffffffffffffe64.value_ = (uint)(in_stack_fffffffffffffe74 + fVar9);
                  in_stack_fffffffffffffe68 =
                       (DracoOptions<draco::GeometryAttribute::Type> *)
                       std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                                 ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                                  in_stack_fffffffffffffe50,
                                  CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
                  *(uint *)&(in_stack_fffffffffffffe68->global_options_).options_._M_t._M_impl =
                       in_stack_fffffffffffffe64.value_;
                }
                in_stack_fffffffffffffe58 =
                     (GeometryAttribute *)PointAttribute::buffer((PointAttribute *)0x1edf27);
                in_stack_fffffffffffffe50 = (PointCloud *)(long)local_d0;
                std::unique_ptr<float[],_std::default_delete<float[]>_>::get
                          ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                           in_stack_fffffffffffffe50);
                DataBuffer::Write((DataBuffer *)
                                  CONCAT44(in_stack_fffffffffffffe64.value_,
                                           in_stack_fffffffffffffe60),
                                  (int64_t)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                                  CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
                local_d0 = local_c0 + local_d0;
                local_e8 = local_e8 + 1;
              }
              local_78 = 0;
            }
            else {
              local_1 = 0;
              local_78 = 1;
            }
            std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
                      ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                       in_stack_fffffffffffffe50);
            goto joined_r0x001edaf0;
          }
          PointAttribute::CopyFrom(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        }
      }
      local_1c = local_1c + 1;
    }
    local_1 = 1;
  }
LAB_001edfda:
  return (bool)(local_1 & 1);
}

Assistant:

bool KdTreeAttributesDecoder::TransformAttributesToOriginalFormat() {
  if (quantized_portable_attributes_.empty() && min_signed_values_.empty()) {
    return true;
  }
  int num_processed_quantized_attributes = 0;
  int num_processed_signed_components = 0;
  // Dequantize attributes that needed it.
  for (int i = 0; i < GetNumAttributes(); ++i) {
    const int att_id = GetAttributeId(i);
    PointAttribute *const att = GetDecoder()->point_cloud()->attribute(att_id);
    if (att->data_type() == DT_INT32 || att->data_type() == DT_INT16 ||
        att->data_type() == DT_INT8) {
      std::vector<uint32_t> unsigned_val(att->num_components());
      std::vector<int32_t> signed_val(att->num_components());
      // Values are stored as unsigned in the attribute, make them signed again.
      if (att->data_type() == DT_INT32) {
        if (!TransformAttributeBackToSignedType<int32_t>(
                att, num_processed_signed_components)) {
          return false;
        }
      } else if (att->data_type() == DT_INT16) {
        if (!TransformAttributeBackToSignedType<int16_t>(
                att, num_processed_signed_components)) {
          return false;
        }
      } else if (att->data_type() == DT_INT8) {
        if (!TransformAttributeBackToSignedType<int8_t>(
                att, num_processed_signed_components)) {
          return false;
        }
      }
      num_processed_signed_components += att->num_components();
    } else if (att->data_type() == DT_FLOAT32) {
      // TODO(ostava): This code should be probably moved out to attribute
      // transform and shared with the SequentialQuantizationAttributeDecoder.

      const PointAttribute *const src_att =
          quantized_portable_attributes_[num_processed_quantized_attributes]
              .get();

      const AttributeQuantizationTransform &transform =
          attribute_quantization_transforms_
              [num_processed_quantized_attributes];

      num_processed_quantized_attributes++;

      if (GetDecoder()->options()->GetAttributeBool(
              att->attribute_type(), "skip_attribute_transform", false)) {
        // Attribute transform should not be performed. In this case, we replace
        // the output geometry attribute with the portable attribute.
        // TODO(ostava): We can potentially avoid this copy by introducing a new
        // mechanism that would allow to use the final attributes as portable
        // attributes for predictors that may need them.
        att->CopyFrom(*src_att);
        continue;
      }

      // Convert all quantized values back to floats.
      const int32_t max_quantized_value =
          (1u << static_cast<uint32_t>(transform.quantization_bits())) - 1;
      const int num_components = att->num_components();
      const int entry_size = sizeof(float) * num_components;
      const std::unique_ptr<float[]> att_val(new float[num_components]);
      int quant_val_id = 0;
      int out_byte_pos = 0;
      Dequantizer dequantizer;
      if (!dequantizer.Init(transform.range(), max_quantized_value)) {
        return false;
      }
      const uint32_t *const portable_attribute_data =
          reinterpret_cast<const uint32_t *>(
              src_att->GetAddress(AttributeValueIndex(0)));
      for (uint32_t i = 0; i < src_att->size(); ++i) {
        for (int c = 0; c < num_components; ++c) {
          float value = dequantizer.DequantizeFloat(
              portable_attribute_data[quant_val_id++]);
          value = value + transform.min_value(c);
          att_val[c] = value;
        }
        // Store the floating point value into the attribute buffer.
        att->buffer()->Write(out_byte_pos, att_val.get(), entry_size);
        out_byte_pos += entry_size;
      }
    }
  }
  return true;
}